

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O0

XMLNodeAdapter * BSDFData::operator<<(XMLNodeAdapter *node,DataDefinition *dataDefinition)

{
  DataDefinition *pDVar1;
  allocator<char> local_111;
  string local_110;
  Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  allocator<char> local_c1;
  string local_c0;
  Child<const_BSDFData::AngleBasis> local_a0;
  allocator<char> local_61;
  string local_60;
  Child<const_std::optional<BSDFData::IncidentDataStructure>_> local_40;
  DataDefinition *local_18;
  DataDefinition *dataDefinition_local;
  XMLNodeAdapter *node_local;
  
  local_18 = dataDefinition;
  dataDefinition_local = (DataDefinition *)node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"IncidentDataStructure",&local_61);
  FileParse::Child<const_std::optional<BSDFData::IncidentDataStructure>_>::Child
            (&local_40,&local_60,&local_18->incidentDataStructure,0);
  FileParse::operator<<(node,&local_40);
  FileParse::Child<const_std::optional<BSDFData::IncidentDataStructure>_>::~Child(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pDVar1 = dataDefinition_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"AngleBasis",&local_c1);
  FileParse::Child<const_BSDFData::AngleBasis>::Child(&local_a0,&local_c0,&local_18->angleBasis,0);
  FileParse::operator<<((XMLNodeAdapter *)pDVar1,&local_a0);
  FileParse::Child<const_BSDFData::AngleBasis>::~Child(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pDVar1 = dataDefinition_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Comments",&local_111);
  FileParse::
  Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_f0,&local_110,&local_18->comments,0);
  FileParse::operator<<((XMLNodeAdapter *)pDVar1,&local_f0);
  FileParse::
  Child<const_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Child(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  return (XMLNodeAdapter *)dataDefinition_local;
}

Assistant:

NodeAdapter & operator<<(NodeAdapter & node, const BSDFData::DataDefinition & dataDefinition)
    {
        node << FileParse::Child{"IncidentDataStructure", dataDefinition.incidentDataStructure};
        node << FileParse::Child{"AngleBasis", dataDefinition.angleBasis};
        node << FileParse::Child{"Comments", dataDefinition.comments};

        return node;
    }